

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O3

int fwrite_xattr(CURL *curl,char *url,int fd)

{
  char *pcVar1;
  char *__value;
  int iVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  char *value;
  char *local_40;
  char *local_38;
  
  local_38 = url;
  iVar2 = fsetxattr(fd,"user.creator","curl",4,0);
  if (iVar2 == 0) {
    lVar5 = 8;
    do {
      if (lVar5 + 0x10 == 0x38) {
        lVar5 = curl_url();
        if ((((lVar5 == 0) || (iVar2 = curl_url_set(lVar5,0,local_38,0x200), iVar2 != 0)) ||
            (iVar2 = curl_url_set(lVar5,2,0,0), iVar2 != 0)) ||
           ((iVar2 = curl_url_set(lVar5,3,0,0), iVar2 != 0 ||
            (iVar2 = curl_url_get(lVar5,0,&local_40,0), iVar2 != 0)))) {
          curl_url_cleanup(lVar5);
        }
        else {
          curl_url_cleanup(lVar5);
          pcVar1 = local_40;
          if (local_40 != (char *)0x0) {
            sVar4 = strlen(local_40);
            iVar2 = fsetxattr(fd,"user.xdg.origin.url",pcVar1,sVar4,0);
            curl_free(pcVar1);
            return iVar2;
          }
        }
        return 1;
      }
      pcVar1 = *(char **)((long)&http_version[5].num + lVar5);
      local_40 = (char *)0x0;
      iVar2 = 0;
      iVar3 = curl_easy_getinfo(curl,*(undefined4 *)((long)&mappings[0].attr + lVar5),&local_40);
      __value = local_40;
      if (local_40 != (char *)0x0 && iVar3 == 0) {
        sVar4 = strlen(local_40);
        iVar2 = fsetxattr(fd,pcVar1,__value,sVar4,0);
      }
      lVar5 = lVar5 + 0x10;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

int fwrite_xattr(CURL *curl, const char *url, int fd)
{
  int i = 0;
  int err = xattr(fd, "user.creator", "curl");

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(!err && mappings[i].attr) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value)
      err = xattr(fd, mappings[i].attr, value);
    i++;
  }
  if(!err) {
    char *nurl = stripcredentials(url);
    if(!nurl)
      return 1;
    err = xattr(fd, "user.xdg.origin.url", nurl);
    curl_free(nurl);
  }
  return err;
}